

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
get(Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  long lVar1;
  runtime_error *this_00;
  reference pvVar2;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  size_t end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  ParseLocation l;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *__p;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *in_stack_fffffffffffffed0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  local_e0;
  ulong local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *local_88;
  string local_68 [32];
  undefined1 local_48 [40];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  *local_20;
  
  if (in_RSI[4] == 0) {
    local_20 = &local_e0;
    (**(code **)(*in_RSI + 0x28))(local_48);
    (**(code **)(*in_RSI + 0x20))(local_68);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_embree::ParseLocation_&,_true>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (ParseLocation *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_68);
    ParseLocation::~ParseLocation((ParseLocation *)0x161cb8);
    __p = &local_e0;
    local_88 = __p;
    if (in_RSI[3] + in_RSI[4] == 0x400) {
      if (in_RSI[3] == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_RSI[2] = in_RSI[2] + 1U & 0x3ff;
      in_RSI[3] = in_RSI[3] + -1;
    }
    lVar1 = in_RSI[4];
    in_RSI[4] = lVar1 + 1;
    local_90 = (ulong)((int)in_RSI[2] + (int)in_RSI[3] + (int)lVar1 & 0x3ff);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                  *)(in_RSI + 5),local_90);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::operator=(in_stack_fffffffffffffec0,__p);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::~pair(in_stack_fffffffffffffec0);
  }
  pvVar2 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
           ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                         *)(in_RSI + 5),in_RSI[2] + in_RSI[3] & 0x3ff);
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar2);
  in_RSI[3] = in_RSI[3] + 1;
  in_RSI[4] = in_RSI[4] + -1;
  return in_RDI;
}

Assistant:

T get() {
      if (future == 0) push_back(nextHelper());
      T t = buffer[(start+past)%BUF_SIZE].first;
      past++; future--;
      return t;
    }